

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                   (string *__return_storage_ptr__,char (*a) [34],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [45],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [2],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  size_type local_d8;
  pointer local_d0;
  undefined8 local_c8;
  size_t local_c0;
  char (*local_b8) [45];
  undefined8 local_b0;
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  size_t local_90;
  char (*local_88) [14];
  undefined8 local_80;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  size_t local_60;
  char (*local_58) [2];
  undefined8 local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  local_f0.first._M_len = strlen(*a);
  local_f0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d0 = (b->_M_dataplus)._M_p;
  local_d8 = b->_M_string_length;
  local_c8 = 0;
  local_f0.first._M_str = *a;
  local_c0 = strlen(*args);
  local_b0 = 0;
  local_a0 = (args_1->_M_dataplus)._M_p;
  local_a8 = args_1->_M_string_length;
  local_98 = 0;
  local_b8 = args;
  local_90 = strlen(*args_2);
  local_80 = 0;
  local_70 = (args_3->_M_dataplus)._M_p;
  local_78 = args_3->_M_string_length;
  local_68 = 0;
  local_88 = args_2;
  local_60 = strlen(*args_4);
  local_58 = args_4;
  local_50 = 0;
  local_40 = (args_5->_M_dataplus)._M_p;
  local_48 = args_5->_M_string_length;
  local_38 = 0;
  views._M_len = 8;
  views._M_array = &local_f0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}